

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

void __thiscall iDynTree::KinDynComputations::computeBiasAccFwdKinematics(KinDynComputations *this)

{
  FrameVelocityRepresentation FVar1;
  KinDynComputationsPrivateAttributes *pKVar2;
  bool bVar3;
  Transform *inertial_H_body;
  Twist *bodyFixedVel;
  Rotation *inertial_R_body;
  Vector6 zeroBaseAcc;
  SpatialAcc local_98;
  VectorFixSize<6U> *local_60 [2];
  VectorFixSize<6U> local_50;
  
  if (this->pimpl->m_areBiasAccelerationsUpdated != false) {
    return;
  }
  VectorFixSize<6U>::zero(&local_50);
  pKVar2 = this->pimpl;
  FVar1 = pKVar2->m_frameVelRepr;
  if (FVar1 == INERTIAL_FIXED_REPRESENTATION) {
    inertial_H_body = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    convertInertialAccelerationToBodyFixedAcceleration(&local_98,&local_50,inertial_H_body);
    pKVar2 = this->pimpl;
  }
  else {
    if (FVar1 == BODY_FIXED_REPRESENTATION) {
      local_60[0] = &local_50;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      _set_noalias<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_98,
                 (DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_60);
      fromEigen(&(pKVar2->m_baseBiasAcc).super_SpatialMotionVector,
                (Matrix<double,_6,_1,_0,_6,_1> *)&local_98);
      goto LAB_00123ba0;
    }
    bodyFixedVel = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    inertial_R_body = (Rotation *)iDynTree::Transform::getRotation();
    convertMixedAccelerationToBodyFixedAcceleration
              (&local_98,&local_50,bodyFixedVel,inertial_R_body);
    pKVar2 = this->pimpl;
  }
  iDynTree::SpatialAcc::operator=(&pKVar2->m_baseBiasAcc,&local_98);
LAB_00123ba0:
  pKVar2 = this->pimpl;
  bVar3 = (bool)iDynTree::ForwardBiasAccKinematics
                          (&pKVar2->m_robot_model,&pKVar2->m_traversal,&pKVar2->m_pos,&pKVar2->m_vel
                           ,&pKVar2->m_baseBiasAcc,&pKVar2->m_linkVel,&pKVar2->m_linkBiasAcc);
  iDynTree::reportErrorIf
            ((bool)(bVar3 ^ 1),"KinDynComputations::computeBiasAccFwdKinematics",
             "Error in computing the bias accelerations.");
  this->pimpl->m_areBiasAccelerationsUpdated = bVar3;
  return;
}

Assistant:

void KinDynComputations::computeBiasAccFwdKinematics()
{
    if( this->pimpl->m_areBiasAccelerationsUpdated )
    {
        return;
    }

    // Convert input base acceleration, that in this case is zero
    Vector6 zeroBaseAcc;
    zeroBaseAcc.zero();
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_baseBiasAcc,toEigen(zeroBaseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_baseBiasAcc = convertInertialAccelerationToBodyFixedAcceleration(zeroBaseAcc, pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_baseBiasAcc = convertMixedAccelerationToBodyFixedAcceleration(zeroBaseAcc,
                                                                               pimpl->m_vel.baseVel(),
                                                                               pimpl->m_pos.worldBasePos().getRotation());
    }

    // Compute body-fixed bias accelerations
    bool ok = ForwardBiasAccKinematics(pimpl->m_robot_model,
                                       pimpl->m_traversal,
                                       pimpl->m_pos,
                                       pimpl->m_vel,
                                       pimpl->m_baseBiasAcc,
                                       pimpl->m_linkVel,
                                       pimpl->m_linkBiasAcc);

    reportErrorIf(!ok,"KinDynComputations::computeBiasAccFwdKinematics","Error in computing the bias accelerations.");

    this->pimpl->m_areBiasAccelerationsUpdated = ok;
}